

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

BinaryExpr<const_type_safe::tagged_union<int,_double,_debugger_type>::type_id_&,_const_type_safe::tagged_union<int,_double,_debugger_type>::type_id_&>
* __thiscall
Catch::ExprLhs<type_safe::tagged_union<int,double,debugger_type>::type_id_const&>::operator==
          (BinaryExpr<const_type_safe::tagged_union<int,_double,_debugger_type>::type_id_&,_const_type_safe::tagged_union<int,_double,_debugger_type>::type_id_&>
           *__return_storage_ptr__,
          ExprLhs<type_safe::tagged_union<int,double,debugger_type>::type_id_const&> *this,
          type_id *rhs)

{
  type_id *lhs;
  bool comparisonResult;
  StringRef local_30;
  type_id *local_20;
  type_id *rhs_local;
  ExprLhs<const_type_safe::tagged_union<int,_double,_debugger_type>::type_id_&> *this_local;
  
  local_20 = rhs;
  rhs_local = (type_id *)this;
  this_local = (ExprLhs<const_type_safe::tagged_union<int,_double,_debugger_type>::type_id_&> *)
               __return_storage_ptr__;
  comparisonResult =
       compareEqual<type_safe::tagged_union<int,double,debugger_type>::type_id,type_safe::tagged_union<int,double,debugger_type>::type_id>
                 (*(type_id **)this,rhs);
  lhs = *(type_id **)this;
  StringRef::StringRef(&local_30,"==");
  BinaryExpr<const_type_safe::tagged_union<int,_double,_debugger_type>::type_id_&,_const_type_safe::tagged_union<int,_double,_debugger_type>::type_id_&>
  ::BinaryExpr(__return_storage_ptr__,comparisonResult,lhs,local_30,local_20);
  return __return_storage_ptr__;
}

Assistant:

auto operator == ( RhsT const& rhs ) -> BinaryExpr<LhsT, RhsT const&> const {
            return { compareEqual( m_lhs, rhs ), m_lhs, "==", rhs };
        }